

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

double __thiscall icu_63::ChineseCalendar::daysToMillis(ChineseCalendar *this,double days)

{
  UBool UVar1;
  UErrorCode local_34;
  int local_30;
  UErrorCode status;
  int32_t dstOffset;
  int32_t rawOffset;
  double millis;
  double days_local;
  ChineseCalendar *this_local;
  
  _dstOffset = days * 86400000.0;
  if (this->fZoneAstroCalc != (TimeZone *)0x0) {
    local_34 = U_ZERO_ERROR;
    millis = days;
    days_local = (double)this;
    (*(this->fZoneAstroCalc->super_UObject)._vptr_UObject[6])
              (_dstOffset,this->fZoneAstroCalc,0,&status,&local_30,&local_34);
    UVar1 = ::U_SUCCESS(local_34);
    if (UVar1 != '\0') {
      return _dstOffset - (double)(status + local_30);
    }
  }
  return _dstOffset - 28800000.0;
}

Assistant:

double ChineseCalendar::daysToMillis(double days) const {
    double millis = days * (double)kOneDay;
    if (fZoneAstroCalc != NULL) {
        int32_t rawOffset, dstOffset;
        UErrorCode status = U_ZERO_ERROR;
        fZoneAstroCalc->getOffset(millis, FALSE, rawOffset, dstOffset, status);
        if (U_SUCCESS(status)) {
        	return millis - (double)(rawOffset + dstOffset);
        }
    }
    return millis - (double)CHINA_OFFSET;
}